

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

void __thiscall LatencyCollector::LatencyCollector(LatencyCollector *this)

{
  ashared_ptr<MapWrapper> *in_RDI;
  MapWrapper *in_stack_ffffffffffffffc8;
  ashared_ptr<MapWrapper> *in_stack_ffffffffffffffd0;
  ashared_ptr<MapWrapper> *in_stack_ffffffffffffffd8;
  ashared_ptr<MapWrapper> *in_stack_ffffffffffffffe0;
  
  std::mutex::mutex((mutex *)0x105af8);
  ashared_ptr<MapWrapper>::ashared_ptr(in_RDI);
  operator_new(0x38);
  MapWrapper::MapWrapper((MapWrapper *)0x105b26);
  ashared_ptr<MapWrapper>::ashared_ptr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ashared_ptr<MapWrapper>::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ashared_ptr<MapWrapper>::~ashared_ptr((ashared_ptr<MapWrapper> *)0x105b58);
  return;
}

Assistant:

LatencyCollector() {
        latestMap = MapWrapperSP(new MapWrapper());
    }